

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O0

google_protobuf_FileDescriptorProto *
upb_ToProto_ConvertFileDef(upb_ToProto_Context *ctx,upb_FileDef *f)

{
  int iVar1;
  upb_FileDef *f_local;
  upb_ToProto_Context *ctx_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)ctx->err);
  if (iVar1 == 0) {
    ctx_local = (upb_ToProto_Context *)filedef_toproto(ctx,f);
  }
  else {
    ctx_local = (upb_ToProto_Context *)0x0;
  }
  return (google_protobuf_FileDescriptorProto *)ctx_local;
}

Assistant:

google_protobuf_FileDescriptorProto* upb_ToProto_ConvertFileDef(
    upb_ToProto_Context* const ctx, const upb_FileDef* const f) {
  if (UPB_SETJMP(ctx->err)) return NULL;
  return filedef_toproto(ctx, f);
}